

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.cpp
# Opt level: O3

void __thiscall Document::append_paragraph(Document *this,Paragraph *p)

{
  pointer *pppPVar1;
  pointer ppPVar2;
  Paragraph *this_00;
  iterator __position;
  int iVar3;
  int iVar4;
  size_t sVar5;
  bool local_29;
  Paragraph *local_28;
  
  ppPVar2 = (this->_paragraph).super__Vector_base<Paragraph_*,_std::allocator<Paragraph_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  local_28 = p;
  if ((ppPVar2 ==
       (this->_paragraph).super__Vector_base<Paragraph_*,_std::allocator<Paragraph_*>_>._M_impl.
       super__Vector_impl_data._M_start) || (this_00 = ppPVar2[-1], this_00 == (Paragraph *)0x0)) {
    if (p == (Paragraph *)0x0) {
      return;
    }
  }
  else {
    iVar3 = (*p->_vptr_Paragraph[1])(p);
    iVar4 = (*this_00->_vptr_Paragraph[1])(this_00);
    if (iVar3 < iVar4) {
      local_29 = true;
      Paragraph::last(this_00,&local_29);
    }
  }
  sVar5 = Paragraph::size(p);
  if (sVar5 != 0) {
    __position._M_current =
         (this->_paragraph).super__Vector_base<Paragraph_*,_std::allocator<Paragraph_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->_paragraph).super__Vector_base<Paragraph_*,_std::allocator<Paragraph_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Paragraph*,std::allocator<Paragraph*>>::_M_realloc_insert<Paragraph*const&>
                ((vector<Paragraph*,std::allocator<Paragraph*>> *)&this->_paragraph,__position,
                 &local_28);
    }
    else {
      *__position._M_current = p;
      pppPVar1 = &(this->_paragraph).super__Vector_base<Paragraph_*,_std::allocator<Paragraph_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppPVar1 = *pppPVar1 + 1;
    }
  }
  return;
}

Assistant:

void Document::append_paragraph(Paragraph * p) {
	Paragraph *last_p(nullptr);

	if (_paragraph.size()) {
		last_p = _paragraph.back();
	}

	if (last_p and p->level() < last_p->level()) {
		last_p->last(true);
	}

	if (p and p->size()) {
		_paragraph.push_back(p);
	}
}